

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

int xmlRelaxNGRemoveRedefine
              (xmlRelaxNGParserCtxtPtr ctxt,xmlChar *URL,xmlNodePtr target,xmlChar *name)

{
  xmlRelaxNGParserCtxtPtr pxVar1;
  xmlHashTablePtr pxVar2;
  long lVar3;
  int iVar4;
  xmlChar *value;
  xmlNodePtr pxVar5;
  xmlNodePtr extraout_RDX;
  xmlNodePtr extraout_RDX_00;
  xmlNodePtr target_00;
  xmlNodePtr extraout_RDX_01;
  int iVar6;
  
  if (ctxt == (xmlRelaxNGParserCtxtPtr)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    do {
      pxVar1 = (xmlRelaxNGParserCtxtPtr)ctxt->grammar;
      if (URL == (xmlChar *)0x0) {
        if ((((*(xmlNs **)&ctxt->nbWarnings == (xmlNs *)0x0) ||
             (*(xmlElementType *)&ctxt->error != XML_ELEMENT_NODE)) ||
            (iVar4 = xmlStrEqual((xmlChar *)ctxt->warning,(xmlChar *)"start"), iVar4 == 0)) ||
           (iVar4 = xmlStrEqual((*(xmlNs **)&ctxt->nbWarnings)->href,
                                (xmlChar *)"http://relaxng.org/ns/structure/1.0"), iVar4 == 0))
        goto LAB_001721d9;
        xmlUnlinkNode((xmlNodePtr)ctxt);
        xmlFreeNode((xmlNodePtr)ctxt);
        iVar6 = 1;
      }
      else if (((*(xmlNs **)&ctxt->nbWarnings == (xmlNs *)0x0) ||
               (*(xmlElementType *)&ctxt->error != XML_ELEMENT_NODE)) ||
              ((iVar4 = xmlStrEqual((xmlChar *)ctxt->warning,"define"), iVar4 == 0 ||
               (iVar4 = xmlStrEqual((*(xmlNs **)&ctxt->nbWarnings)->href,
                                    (xmlChar *)"http://relaxng.org/ns/structure/1.0"), iVar4 == 0)))
              ) {
LAB_001721d9:
        if (((*(xmlNs **)&ctxt->nbWarnings != (xmlNs *)0x0) &&
            (*(xmlElementType *)&ctxt->error == XML_ELEMENT_NODE)) &&
           ((iVar4 = xmlStrEqual((xmlChar *)ctxt->warning,(xmlChar *)"include"), iVar4 != 0 &&
            (iVar4 = xmlStrEqual((*(xmlNs **)&ctxt->nbWarnings)->href,
                                 (xmlChar *)"http://relaxng.org/ns/structure/1.0"), iVar4 != 0)))) {
          pxVar2 = ctxt->interleaves;
          pxVar5 = extraout_RDX;
          if ((((pxVar2 != (xmlHashTablePtr)0x0) && (pxVar2->dict != (xmlDictPtr)0x0)) &&
              (lVar3 = *(long *)&pxVar2->dict->nbElems, lVar3 != 0)) &&
             (iVar4 = xmlStrEqual(*(xmlChar **)(lVar3 + 0x10),"grammar"), pxVar5 = extraout_RDX_00,
             iVar4 != 0)) {
            pxVar5 = xmlDocGetRootElement((xmlDoc *)pxVar2->dict);
            iVar4 = xmlRelaxNGRemoveRedefine
                              ((xmlRelaxNGParserCtxtPtr)pxVar5->children,URL,target_00,name);
            pxVar5 = extraout_RDX_01;
            if (iVar4 == 1) {
              iVar6 = 1;
            }
          }
          iVar4 = xmlRelaxNGRemoveRedefine((xmlRelaxNGParserCtxtPtr)ctxt->serror,URL,pxVar5,name);
          if (iVar4 == 1) {
            iVar6 = 1;
          }
        }
      }
      else {
        value = xmlGetProp((xmlNode *)ctxt,"name");
        xmlRelaxNGNormExtSpace(value);
        if (value != (xmlChar *)0x0) {
          iVar4 = xmlStrEqual(URL,value);
          if (iVar4 != 0) {
            xmlUnlinkNode((xmlNodePtr)ctxt);
            xmlFreeNode((xmlNodePtr)ctxt);
            iVar6 = 1;
          }
          (*xmlFree)(value);
        }
      }
      ctxt = pxVar1;
    } while (pxVar1 != (xmlRelaxNGParserCtxtPtr)0x0);
  }
  return iVar6;
}

Assistant:

static int
xmlRelaxNGRemoveRedefine(xmlRelaxNGParserCtxtPtr ctxt,
                         const xmlChar * URL ATTRIBUTE_UNUSED,
                         xmlNodePtr target, const xmlChar * name)
{
    int found = 0;
    xmlNodePtr tmp, tmp2;
    xmlChar *name2;

#ifdef DEBUG_INCLUDE
    if (name == NULL)
        xmlGenericError(xmlGenericErrorContext,
                        "Elimination of <include> start from %s\n", URL);
    else
        xmlGenericError(xmlGenericErrorContext,
                        "Elimination of <include> define %s from %s\n",
                        name, URL);
#endif
    tmp = target;
    while (tmp != NULL) {
        tmp2 = tmp->next;
        if ((name == NULL) && (IS_RELAXNG(tmp, "start"))) {
            found = 1;
            xmlUnlinkNode(tmp);
            xmlFreeNode(tmp);
        } else if ((name != NULL) && (IS_RELAXNG(tmp, "define"))) {
            name2 = xmlGetProp(tmp, BAD_CAST "name");
            xmlRelaxNGNormExtSpace(name2);
            if (name2 != NULL) {
                if (xmlStrEqual(name, name2)) {
                    found = 1;
                    xmlUnlinkNode(tmp);
                    xmlFreeNode(tmp);
                }
                xmlFree(name2);
            }
        } else if (IS_RELAXNG(tmp, "include")) {
            xmlChar *href = NULL;
            xmlRelaxNGDocumentPtr inc = tmp->psvi;

            if ((inc != NULL) && (inc->doc != NULL) &&
                (inc->doc->children != NULL)) {

                if (xmlStrEqual
                    (inc->doc->children->name, BAD_CAST "grammar")) {
#ifdef DEBUG_INCLUDE
                    href = xmlGetProp(tmp, BAD_CAST "href");
#endif
                    if (xmlRelaxNGRemoveRedefine(ctxt, href,
                                                 xmlDocGetRootElement(inc->doc)->children,
                                                 name) == 1) {
                        found = 1;
                    }
#ifdef DEBUG_INCLUDE
                    if (href != NULL)
                        xmlFree(href);
#endif
                }
            }
            if (xmlRelaxNGRemoveRedefine(ctxt, URL, tmp->children, name) == 1) {
                found = 1;
            }
        }
        tmp = tmp2;
    }
    return (found);
}